

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O1

int extend(int f,int n)

{
  line **pplVar1;
  line **pplVar2;
  line *__ptr;
  int iVar3;
  char *fname;
  line *plVar4;
  char local_68 [8];
  char xname [64];
  
  if ((f & 7U) == 0) {
    fname = eread("M-x ",local_68,0x40,9);
  }
  else {
    fname = eread("%d M-x ",local_68,0x40,9,n);
  }
  if (fname == (char *)0x0) {
    iVar3 = 2;
  }
  else if (*fname == '\0') {
    iVar3 = 0;
  }
  else {
    plVar4 = (line *)name_function(fname);
    __ptr = maclcur;
    if (plVar4 == (line *)0x0) {
      iVar3 = dobeep_msg("[No match]");
    }
    else {
      if (macrodef != 0) {
        (&maclcur)[macrocount] = plVar4;
        pplVar1 = &maclcur->l_bp;
        pplVar2 = &maclcur->l_fp;
        maclcur = *pplVar1;
        (*pplVar1)->l_fp = *pplVar2;
        free(__ptr);
      }
      iVar3 = (*(code *)plVar4)(f,n);
    }
  }
  return iVar3;
}

Assistant:

int
extend(int f, int n)
{
	PF	 funct;
	char	 xname[NXNAME], *bufp;

	if (!(f & FFARG))
		bufp = eread("M-x ", xname, NXNAME, EFNEW | EFFUNC);
	else
		bufp = eread("%d M-x ", xname, NXNAME, EFNEW | EFFUNC, n);
	if (bufp == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	if ((funct = name_function(bufp)) != NULL) {
		if (macrodef) {
			struct line	*lp = maclcur;
			macro[macrocount - 1].m_funct = funct;
			maclcur = lp->l_bp;
			maclcur->l_fp = lp->l_fp;
			free(lp);
		}
		return ((*funct)(f, n));
	}
	return (dobeep_msg("[No match]"));
}